

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

void Kf_SetSelectBest(Kf_Set_t *p,int fArea,int fSort)

{
  Kf_Cut_t *pKVar1;
  Kf_Cut_t *pKVar2;
  Kf_Cut_t *pKVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  Kf_Cut_t **ppKVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar10 = (ulong)p->nLutSize;
  pKVar1 = p->pCutsR;
  uVar7 = 0;
  uVar6 = 0;
  do {
    lVar5 = (long)p->pList[uVar6];
    if (-1 < lVar5) {
      uVar4 = p->nCutNum - 1;
      do {
        p->ppCuts[(int)uVar7] = pKVar1 + lVar5;
        if (uVar7 == 0) {
          uVar7 = 1;
        }
        else {
          if (0 < (int)uVar7) {
            uVar9 = (ulong)uVar7;
            do {
              pKVar2 = p->ppCuts[uVar9 - 1];
              pKVar3 = p->ppCuts[uVar9];
              if (fArea == 0) {
                if (pKVar2->Delay < pKVar3->Delay) break;
                if (pKVar2->Delay <= pKVar3->Delay) {
                  if ((pKVar2->nLeaves < pKVar3->nLeaves) ||
                     ((pKVar2->nLeaves <= pKVar3->nLeaves &&
                      (pKVar2->Area < pKVar3->Area || pKVar2->Area == pKVar3->Area)))) break;
                }
              }
              else {
                if (pKVar2->Area < pKVar3->Area) break;
                if (pKVar2->Area <= pKVar3->Area) {
                  if ((pKVar2->Delay < pKVar3->Delay) ||
                     ((pKVar2->Delay <= pKVar3->Delay && (pKVar2->nLeaves <= pKVar3->nLeaves))))
                  break;
                }
              }
              p->ppCuts[uVar9 - 1] = pKVar3;
              p->ppCuts[uVar9] = pKVar2;
              bVar11 = 1 < (long)uVar9;
              uVar9 = uVar9 - 1;
            } while (bVar11);
          }
          uVar7 = uVar7 + 1;
          if ((int)uVar4 <= (int)uVar7) {
            uVar7 = uVar4;
          }
        }
        lVar5 = (long)pKVar1[lVar5].iNext;
      } while (-1 < lVar5);
    }
    bVar11 = uVar6 == uVar10;
    uVar6 = uVar6 + 1;
    if (bVar11) {
      if (((int)uVar7 < 1) || ((int)(uint)p->nCutNum <= (int)uVar7)) {
        __assert_fail("nCuts > 0 && nCuts < p->nCutNum",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                      ,0x124,"void Kf_SetSelectBest(Kf_Set_t *, int, int)");
      }
      p->nCuts = uVar7;
      p->pCutBest = p->ppCuts[0];
      memset(p->pList,0xff,uVar10 * 4 + 4);
      uVar6 = 0;
      do {
        pKVar2 = p->ppCuts[uVar6];
        pKVar2->iNext = p->pList[pKVar2->nLeaves];
        p->pList[pKVar2->nLeaves] = (int)((ulong)((long)pKVar2 - (long)pKVar1) >> 5) * -0x55555555;
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
      p->nCuts = 0;
      do {
        lVar5 = (long)p->pList[uVar10];
        if (-1 < lVar5) {
          uVar6 = (ulong)p->nCuts;
          ppKVar8 = p->ppCuts + uVar6;
          do {
            *ppKVar8 = pKVar1 + lVar5;
            lVar5 = (long)pKVar1[lVar5].iNext;
            ppKVar8 = ppKVar8 + 1;
            uVar4 = (int)uVar6 + 1;
            uVar6 = (ulong)uVar4;
          } while (-1 < lVar5);
          p->nCuts = uVar4;
        }
        bVar11 = 0 < (long)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar11);
      if (p->nCuts == uVar7) {
        return;
      }
      __assert_fail("p->nCuts == nCuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                    ,0x132,"void Kf_SetSelectBest(Kf_Set_t *, int, int)");
    }
  } while( true );
}

Assistant:

static inline void Kf_SetSelectBest( Kf_Set_t * p, int fArea, int fSort )
{
//    int fArea = p->pMan->pPars->fArea;
    Kf_Cut_t * pCut;
    int i, nCuts = 0;
    for ( i = 0; i <= p->nLutSize; i++ )
        Kf_ListForEachCut( p, i, pCut )
            nCuts = Kf_SetStoreAddOne( p, nCuts, p->nCutNum-1, pCut, fArea );
    assert( nCuts > 0 && nCuts < p->nCutNum );
    p->nCuts = nCuts;
    p->pCutBest = p->ppCuts[0];
    if ( !fSort )
        return;
    // sort by size in the reverse order
    for ( i = 0; i <= p->nLutSize; i++ )
        p->pList[i] = -1;
    for ( i = 0; i < nCuts; i++ )
        Kf_SetAddToList( p, p->ppCuts[i], 0 );
    p->nCuts = 0;
    for ( i = p->nLutSize; i >= 0; i-- )
        Kf_ListForEachCut( p, i, pCut )
            p->ppCuts[p->nCuts++] = pCut;
    assert( p->nCuts == nCuts );
}